

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_anomaly_test.cc
# Opt level: O3

ssize_t pwrite_failure_cb(void *ctx,filemgr_ops *normal_ops,int fd,void *buf,size_t count,
                         cs_off_t offset)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  fail_ctx_t *wctx;
  
  iVar1 = *(int *)((long)ctx + 4);
  *(int *)((long)ctx + 4) = iVar1 + 1;
  if (iVar1 < *(int *)((long)ctx + 8)) {
    sVar2 = (*normal_ops->pwrite)(fd,buf,count,offset);
    return sVar2;
  }
  *(int *)ctx = *ctx + 1;
  piVar3 = __errno_location();
  *piVar3 = -2;
  return -4;
}

Assistant:

ssize_t pwrite_failure_cb(void *ctx, struct filemgr_ops *normal_ops,
                          int fd, void *buf, size_t count, cs_off_t offset)
{
    fail_ctx_t *wctx = (fail_ctx_t *)ctx;
    wctx->num_ops++;
    if (wctx->num_ops > wctx->start_failing_after) {
        wctx->num_fails++;
        errno = -2;
        return (ssize_t)FDB_RESULT_WRITE_FAIL;
    }
    return normal_ops->pwrite(fd, buf, count, offset);
}